

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cpp
# Opt level: O0

ggml_type kv_cache_type_from_str(string *s)

{
  bool bVar1;
  const_iterator __lhs;
  const_iterator __rhs;
  runtime_error *this;
  ggml_type *type;
  const_iterator __end1;
  const_iterator __begin1;
  vector<ggml_type,_std::allocator<ggml_type>_> *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  __normal_iterator<const_ggml_type_*,_std::vector<ggml_type,_std::allocator<ggml_type>_>_>
  *in_stack_ffffffffffffffa0;
  string local_48 [32];
  ggml_type *local_28;
  
  __lhs = std::vector<ggml_type,_std::allocator<ggml_type>_>::begin
                    ((vector<ggml_type,_std::allocator<ggml_type>_> *)in_stack_ffffffffffffff98);
  __rhs = std::vector<ggml_type,_std::allocator<ggml_type>_>::end
                    ((vector<ggml_type,_std::allocator<ggml_type>_> *)in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffa0,
                       (__normal_iterator<const_ggml_type_*,_std::vector<ggml_type,_std::allocator<ggml_type>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar1) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+((char *)__lhs._M_current,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __rhs._M_current);
      std::runtime_error::runtime_error(this,local_48);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_28 = __gnu_cxx::
               __normal_iterator<const_ggml_type_*,_std::vector<ggml_type,_std::allocator<ggml_type>_>_>
               ::operator*((__normal_iterator<const_ggml_type_*,_std::vector<ggml_type,_std::allocator<ggml_type>_>_>
                            *)&stack0xffffffffffffffe8);
    ggml_type_name(*local_28);
    bVar1 = std::operator==((char *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_ggml_type_*,_std::vector<ggml_type,_std::allocator<ggml_type>_>_>::
    operator++((__normal_iterator<const_ggml_type_*,_std::vector<ggml_type,_std::allocator<ggml_type>_>_>
                *)&stack0xffffffffffffffe8);
  }
  return *local_28;
}

Assistant:

static ggml_type kv_cache_type_from_str(const std::string & s) {
    for (const auto & type : kv_cache_types) {
        if (ggml_type_name(type) == s) {
            return type;
        }
    }
    throw std::runtime_error("Unsupported cache type: " + s);
}